

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall VM::exec(VM *this)

{
  StackFrame *this_00;
  value_type pSVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  reference ppuVar4;
  reference ppSVar5;
  size_type sVar6;
  uchar *local_a0;
  void *addr_2;
  size_t i_2;
  size_t i_1;
  StackFrame **args;
  size_t argcount;
  FunctionInformation *info;
  ulong uStack_68;
  int funcid;
  size_t i;
  StackFrame *frame;
  bool shouldBranch;
  void *pvStack_50;
  int offset;
  void *addr_1;
  StackFrame *addr_val;
  StackFrame *val;
  size_t sz;
  void *addr;
  uchar *puStack_20;
  int len;
  uchar *oldip;
  VM *pVStack_10;
  uchar opcode;
  VM *this_local;
  
  pVStack_10 = this;
  do {
    puStack_20 = this->cip;
    read<unsigned_char>(this,(uchar *)((long)&oldip + 7));
    switch(oldip._7_1_) {
    case 0:
      read<int>(this,(int *)((long)&addr + 4));
      push(this,this->cip,(long)addr._4_4_);
      this->cip = this->cip + addr._4_4_;
      break;
    case 1:
      pop(this);
      break;
    case 2:
      pop<unsigned_long>(this,(unsigned_long *)&val);
      pop<void*>(this,(void **)&sz);
      push(this,(void *)sz,(size_t)val);
      break;
    case 3:
      sVar6 = std::vector<StackFrame_*,_std::allocator<StackFrame_*>_>::size(&this->stack);
      ppSVar5 = std::vector<StackFrame_*,_std::allocator<StackFrame_*>_>::operator[]
                          (&this->stack,sVar6 - 2);
      addr_val = *ppSVar5;
      sVar6 = std::vector<StackFrame_*,_std::allocator<StackFrame_*>_>::size(&this->stack);
      ppSVar5 = std::vector<StackFrame_*,_std::allocator<StackFrame_*>_>::operator[]
                          (&this->stack,sVar6 - 1);
      addr_1 = *ppSVar5;
      pvStack_50 = *(void **)((value_type)addr_1)->ptr;
      memcpy(pvStack_50,addr_val->ptr,addr_val->size);
      pop(this);
      pop(this);
      break;
    case 4:
      pop<int>(this,(int *)((long)&frame + 4));
      frame._3_1_ = 0;
      ppSVar5 = std::vector<StackFrame_*,_std::allocator<StackFrame_*>_>::back(&this->stack);
      i = (size_t)*ppSVar5;
      for (uStack_68 = 0; uStack_68 < ((value_type)i)->size; uStack_68 = uStack_68 + 1) {
        if (((value_type)i)->ptr[uStack_68] != '\0') {
          frame._3_1_ = 1;
        }
      }
      pop(this);
      if ((frame._3_1_ & 1) != 0) {
        this->cip = this->firmware + frame._4_4_;
      }
      break;
    case 5:
      read<int>(this,(int *)((long)&info + 4));
      argcount = (size_t)(this->imports + info._4_4_);
      args = (StackFrame **)(long)((FunctionInformation *)argcount)->argcount;
      if ((((FunctionInformation *)argcount)->isExternal & 1U) == 0) {
        std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::push_back
                  (&this->retstack,&this->cip);
        this->cip = this->programBase + *(int *)(argcount + 4);
      }
      else {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = (long)args + 1;
        uVar3 = SUB168(auVar2 * ZEXT816(8),0);
        if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
          uVar3 = 0xffffffffffffffff;
        }
        i_1 = (size_t)operator_new__(uVar3);
        for (i_2 = 0; i_2 < args; i_2 = i_2 + 1) {
          ppSVar5 = std::vector<StackFrame_*,_std::allocator<StackFrame_*>_>::back(&this->stack);
          *(value_type *)(i_1 + ((long)args + (-1 - i_2)) * 8) = *ppSVar5;
          rmstack(this);
        }
        platform_call_wrapper
                  (*(void **)(argcount + 0x18),(StackFrame **)i_1,(size_t)args,
                   (long)*(int *)(argcount + 0xc),(bool)(*(byte *)(argcount + 9) & 1),this);
        for (addr_2 = (void *)0x0; addr_2 < args; addr_2 = (void *)((long)addr_2 + 1)) {
          this_00 = *(StackFrame **)(i_1 + (long)addr_2 * 8);
          if (this_00 != (StackFrame *)0x0) {
            StackFrame::~StackFrame(this_00);
            operator_delete(this_00);
          }
        }
        if (i_1 != 0) {
          operator_delete__((void *)i_1);
        }
      }
      break;
    case 6:
      sVar6 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::size(&this->retstack);
      if (sVar6 == 0) {
        return;
      }
      ppuVar4 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::back
                          (&this->retstack);
      this->cip = *ppuVar4;
      std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::pop_back(&this->retstack);
      break;
    case 7:
      pop<unsigned_char*>(this,&this->rsp);
      break;
    case 8:
      push(this,&this->rsp,8);
      break;
    case 9:
      ppSVar5 = std::vector<StackFrame_*,_std::allocator<StackFrame_*>_>::back(&this->stack);
      local_a0 = (*ppSVar5)->ptr;
      push(this,&local_a0,8);
      sVar6 = std::vector<StackFrame_*,_std::allocator<StackFrame_*>_>::size(&this->stack);
      ppSVar5 = std::vector<StackFrame_*,_std::allocator<StackFrame_*>_>::operator[]
                          (&this->stack,sVar6 - 2);
      pSVar1 = *ppSVar5;
      ppSVar5 = std::vector<StackFrame_*,_std::allocator<StackFrame_*>_>::back(&this->stack);
      (*ppSVar5)->vref = pSVar1;
      break;
    default:
      printf("Illegal instruction\n");
      abort();
    }
  } while( true );
}

Assistant:

void exec() {
    while(1) {
    unsigned char opcode;
    unsigned char* oldip = cip;
    read(opcode);
    switch(opcode) {
    case 0:
    {
      //PUSH constant
      int len;
      read(len);
      push(cip,len);
      cip+=len;
    }
      break;
    case 1:
    {
      //POP
      pop();
    }
      break;
    case 2:
    {
      //Load
      void* addr;
      size_t sz;
      pop(sz);
      pop(addr);
      push(addr,sz);
    }
      break;
    case 3:
    {
      //Store
      StackFrame* val = stack[stack.size()-2];
      StackFrame* addr_val = stack[stack.size()-1];
      void* addr;
      memcpy(&addr,addr_val->ptr,sizeof(void*));
      memcpy(addr,val->ptr,val->size);
      pop();
      pop();
    }
      break;
    case 4:
    {
      //Absolute branch
      int offset;
      pop(offset);
      bool shouldBranch = false;
      
      StackFrame* frame = stack.back();
      for(size_t i = 0;i<frame->size;i++) {
	if(frame->ptr[i]) {
	  shouldBranch = true;
	}
      }
      
      pop();
      if(shouldBranch) {
	cip =firmware+offset;
      }
    }
      break;
    case 5:
    {
      //Procedure call
      int funcid;
      read(funcid);
      FunctionInformation* info = imports+funcid;
      size_t argcount = info->argcount;
      if(info->isExternal) {
      StackFrame** args = new StackFrame*[argcount+1];
      for(size_t i = 0;i<argcount;i++) {
	args[argcount-i-1] = stack.back();
	rmstack();
      }
      
      platform_call_wrapper(info->ptr,args,argcount,info->outsize,info->isVarArgs,this);
      for(size_t i = 0;i<argcount;i++) {
	delete args[i];
      }
      delete[] args;
      }else {
	retstack.push_back(cip);
	cip = programBase+info->offset;
      }
    }
      break;
    case 6:
    {
      //Procedure call return/exit
      if(!retstack.size()) {
	return;
      }
      cip = retstack.back();
      retstack.pop_back();
    }
      break;
    case 7:
    {
      //Set stack pointer
      pop(rsp);
    }
      break;
    case 8:
    {
      //Read stack pointer
      push(&rsp,sizeof(rsp));
    }
      break;
    case 9:
    {
      //This pointer (reference)
      void* addr = stack.back()->ptr;
      push(&addr,sizeof(addr));
      stack.back()->vref = stack[stack.size()-2];
    }
      break;
    default:
    {
      printf("Illegal instruction\n");
      abort();
    }
      break;
  }
    }
  }